

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall
QIconModeViewBase::scrollContentsBy(QIconModeViewBase *this,int dx,int dy,bool scrollElasticBand)

{
  QListViewPrivate *this_00;
  QWidget *this_01;
  LayoutDirection LVar1;
  undefined7 in_register_00000009;
  int dx_00;
  long in_FS_OFFSET;
  QRect QVar2;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,scrollElasticBand) != 0) {
    this_00 = (this->super_QCommonListViewBase).dd;
    LVar1 = QWidget::layoutDirection((QWidget *)(this->super_QCommonListViewBase).qq);
    dx_00 = -dx;
    if (LVar1 != RightToLeft) {
      dx_00 = dx;
    }
    QListViewPrivate::scrollElasticBandBy(this_00,dx_00,dy);
  }
  QCommonListViewBase::scrollContentsBy(&this->super_QCommonListViewBase,dx,dy,false);
  if ((this->draggedItems).d.size != 0) {
    this_01 = (((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
              super_QAbstractScrollAreaPrivate.viewport;
    QVar2 = draggedItemsRect(this);
    local_38.x1.m_i = QVar2.x1.m_i.m_i + dx;
    local_38.x2.m_i = dx + QVar2.x2.m_i.m_i;
    local_38.y1.m_i = QVar2.y1.m_i.m_i + dy;
    local_38.y2.m_i = QVar2.y2.m_i.m_i + dy;
    QWidget::update(this_01,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::scrollContentsBy(int dx, int dy, bool scrollElasticBand)
{
    if (scrollElasticBand)
        dd->scrollElasticBandBy(isRightToLeft() ? -dx : dx, dy);

    QCommonListViewBase::scrollContentsBy(dx, dy, scrollElasticBand);
    if (!draggedItems.isEmpty())
        viewport()->update(draggedItemsRect().translated(dx, dy));
}